

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void __thiscall Server::Server(Server *this,string *server_addr,uint16_t port_no,uint64_t time_out)

{
  uint64_t time_out_local;
  uint16_t port_no_local;
  string *server_addr_local;
  Server *this_local;
  
  std::vector<HTTPResponse_*(*)(Client_*),_std::allocator<HTTPResponse_*(*)(Client_*)>_>::vector
            (&this->http_request_hook);
  std::vector<void_(*)(Server_*),_std::allocator<void_(*)(Server_*)>_>::vector(&this->timer_hook);
  std::__cxx11::string::string((string *)&this->server_addr);
  std::
  unordered_map<int,_Client_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Client_*>_>_>
  ::unordered_map(&this->fd_to_client);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
  ::map(&this->loaded_modules);
  std::__cxx11::string::operator=((string *)&this->server_addr,(string *)server_addr);
  this->port_no = port_no;
  this->time_out = time_out;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
  ::clear(&this->loaded_modules);
  this->time_stamp = 0;
  this->udp_fd = -1;
  return;
}

Assistant:

Server::Server(std::string server_addr, uint16_t port_no, uint64_t time_out /* = 60 */ ) {
    this->server_addr = server_addr;
    this->port_no = port_no;
    this->time_out = time_out;
    this->loaded_modules.clear();
    this->time_stamp = 0;
    this->udp_fd = -1;
}